

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bytestring_test.cc
# Opt level: O1

void __thiscall
anon_unknown.dwarf_18f9de::CBSTest_ASN1Int64_Test::TestBody(CBSTest_ASN1Int64_Test *this)

{
  bool *message;
  CBS_ASN1_TAG tag;
  anon_union_32_2_4f6aaa2e_for_u *paVar1;
  anon_union_32_2_4f6aaa2e_for_u *paVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar3;
  internal iVar4;
  bool bVar5;
  int iVar6;
  undefined8 extraout_RAX;
  ulong uVar7;
  bool *pbVar8;
  AssertHelper AVar9;
  uint8_t *puVar10;
  char *pcVar11;
  char *in_R9;
  long lVar12;
  ScopedTrace gtest_trace_1091;
  AssertionResult gtest_ar__3;
  AssertionResult gtest_ar_;
  ScopedTrace gtest_trace_1092;
  AssertionResult gtest_ar;
  UniquePtr<uint8_t> scoper;
  CBS cbs;
  int is_negative;
  size_t len;
  CBS child;
  uint8_t *out;
  UniquePtr<uint8_t> scoper_1;
  int64_t value;
  ScopedTrace local_121;
  AssertHelper local_120;
  anon_union_32_2_4f6aaa2e_for_u *local_118;
  undefined1 local_110 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_108;
  undefined1 local_100 [24];
  Bytes local_e8;
  undefined1 local_d8 [16];
  anon_union_32_2_4f6aaa2e_for_u local_c8;
  Bytes local_a8;
  undefined1 local_98 [8];
  anon_union_32_2_4f6aaa2e_for_u *local_90;
  int local_84;
  _Head_base<0UL,_unsigned_char_*,_false> local_80;
  CBS local_78;
  anon_union_32_2_4f6aaa2e_for_u *local_68;
  anon_union_32_2_4f6aaa2e_for_u *local_60;
  _Head_base<0UL,_unsigned_char_*,_false> local_58;
  unique_ptr<unsigned_char,_bssl::internal::Deleter> local_50;
  bool *local_48;
  _Head_base<0UL,_unsigned_char_*,_false> local_40;
  ulong local_38;
  
  uVar7 = 0;
  pbVar8 = (bool *)0x0;
  do {
    message = pbVar8 + 0x6f3690;
    paVar1 = *(anon_union_32_2_4f6aaa2e_for_u **)(pbVar8 + 0x6f3698);
    paVar2 = *(anon_union_32_2_4f6aaa2e_for_u **)(pbVar8 + 0x6f36a0);
    local_d8._0_8_ = paVar1;
    local_d8._8_8_ = paVar2;
    local_48 = pbVar8;
    local_38 = uVar7;
    testing::ScopedTrace::ScopedTrace<Bytes>
              (&local_121,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/bytestring/bytestring_test.cc"
               ,0x443,(Bytes *)local_d8);
    testing::ScopedTrace::ScopedTrace<long>
              ((ScopedTrace *)(local_100 + 0x17),
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/bytestring/bytestring_test.cc"
               ,0x444,(long *)message);
    local_98 = (undefined1  [8])paVar1;
    local_90 = paVar2;
    local_68 = paVar2;
    iVar6 = CBS_get_asn1_int64((CBS *)local_98,(int64_t *)&local_40);
    local_110[0] = (internal)(iVar6 != 0);
    local_108 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    if (iVar6 == 0) {
      testing::Message::Message((Message *)&local_78);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)local_d8,(internal *)local_110,
                 (AssertionResult *)"CBS_get_asn1_int64(&cbs, &value)","false","true",in_R9);
      testing::internal::AssertHelper::AssertHelper
                (&local_120,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/bytestring/bytestring_test.cc"
                 ,1099,(char *)local_d8._0_8_);
      testing::internal::AssertHelper::operator=(&local_120,(Message *)&local_78);
      testing::internal::AssertHelper::~AssertHelper(&local_120);
      if ((anon_union_32_2_4f6aaa2e_for_u *)local_d8._0_8_ != &local_c8) {
        operator_delete((void *)local_d8._0_8_,(ulong)(local_c8.base.buf + 1));
      }
      AVar9.data_ = (AssertHelperData *)CONCAT44(local_78.data._4_4_,local_78.data._0_4_);
LAB_00221f52:
      if ((anon_union_32_2_4f6aaa2e_for_u *)AVar9.data_ != (anon_union_32_2_4f6aaa2e_for_u *)0x0) {
        (*(code *)((cbb_child_st *)AVar9.data_)->base->len)();
      }
      if (local_108 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&local_108,local_108);
      }
LAB_00222101:
      testing::ScopedTrace::~ScopedTrace((ScopedTrace *)(local_100 + 0x17));
      testing::ScopedTrace::~ScopedTrace(&local_121);
LAB_00222115:
      if ((local_38 & 1) == 0) {
        return;
      }
      break;
    }
    local_78.data._0_4_ = 0;
    local_110 = (undefined1  [8])local_90;
    local_60 = paVar1;
    testing::internal::CmpHelperEQ<unsigned_int,unsigned_long>
              ((internal *)local_d8,"0u","CBS_len(&cbs)",(uint *)&local_78,
               (unsigned_long *)local_110);
    if (local_d8[0] == (internal)0x0) {
      testing::Message::Message((Message *)local_110);
      puVar10 = "";
      if ((anon_union_32_2_4f6aaa2e_for_u *)local_d8._8_8_ != (anon_union_32_2_4f6aaa2e_for_u *)0x0)
      {
        puVar10 = *(uint8_t **)local_d8._8_8_;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&local_78,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/bytestring/bytestring_test.cc"
                 ,0x44c,(char *)puVar10);
      testing::internal::AssertHelper::operator=((AssertHelper *)&local_78,(Message *)local_110);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_78);
      if (local_110 != (undefined1  [8])0x0) {
        (**(code **)(*(long *)local_110 + 8))();
      }
    }
    if ((anon_union_32_2_4f6aaa2e_for_u *)local_d8._8_8_ != (anon_union_32_2_4f6aaa2e_for_u *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)(local_d8 + 8),
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   local_d8._8_8_);
    }
    testing::internal::CmpHelperEQ<long,long>
              ((internal *)local_d8,"test.value","value",(long *)message,(long *)&local_40);
    if (local_d8[0] == (internal)0x0) {
      testing::Message::Message((Message *)local_110);
      puVar10 = "";
      if ((anon_union_32_2_4f6aaa2e_for_u *)local_d8._8_8_ != (anon_union_32_2_4f6aaa2e_for_u *)0x0)
      {
        puVar10 = *(uint8_t **)local_d8._8_8_;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&local_78,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/bytestring/bytestring_test.cc"
                 ,0x44d,(char *)puVar10);
      testing::internal::AssertHelper::operator=((AssertHelper *)&local_78,(Message *)local_110);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_78);
      if (local_110 != (undefined1  [8])0x0) {
        (**(code **)(*(long *)local_110 + 8))();
      }
    }
    if ((anon_union_32_2_4f6aaa2e_for_u *)local_d8._8_8_ != (anon_union_32_2_4f6aaa2e_for_u *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)(local_d8 + 8),
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   local_d8._8_8_);
    }
    local_98 = (undefined1  [8])local_60;
    local_90 = local_68;
    iVar6 = CBS_get_asn1((CBS *)local_98,&local_78,2);
    local_110[0] = (internal)(iVar6 != 0);
    local_108 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    if (iVar6 == 0) {
      testing::Message::Message((Message *)&local_120);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)local_d8,(internal *)local_110,
                 (AssertionResult *)"CBS_get_asn1(&cbs, &child, 0x2u)","false","true",in_R9);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&local_e8,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/bytestring/bytestring_test.cc"
                 ,0x452,(char *)local_d8._0_8_);
      testing::internal::AssertHelper::operator=((AssertHelper *)&local_e8,(Message *)&local_120);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_e8);
      AVar9.data_ = local_120.data_;
      if ((anon_union_32_2_4f6aaa2e_for_u *)local_d8._0_8_ != &local_c8) {
        operator_delete((void *)local_d8._0_8_,(ulong)(local_c8.base.buf + 1));
        AVar9.data_ = local_120.data_;
      }
      goto LAB_00221f52;
    }
    iVar6 = CBS_is_valid_asn1_integer(&local_78,&local_84);
    local_110[0] = (internal)(iVar6 != 0);
    local_108 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    if (iVar6 == 0) {
      testing::Message::Message((Message *)&local_120);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)local_d8,(internal *)local_110,
                 (AssertionResult *)"CBS_is_valid_asn1_integer(&child, &is_negative)","false","true"
                 ,in_R9);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&local_e8,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/bytestring/bytestring_test.cc"
                 ,0x453,(char *)local_d8._0_8_);
      testing::internal::AssertHelper::operator=((AssertHelper *)&local_e8,(Message *)&local_120);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_e8);
      if ((anon_union_32_2_4f6aaa2e_for_u *)local_d8._0_8_ != &local_c8) {
        operator_delete((void *)local_d8._0_8_,(ulong)(local_c8.base.buf + 1));
      }
      if ((anon_union_32_2_4f6aaa2e_for_u *)local_120.data_ != (anon_union_32_2_4f6aaa2e_for_u *)0x0
         ) {
        (**(code **)(*(long *)local_120.data_ + 8))();
      }
    }
    if (local_108 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_108,local_108);
    }
    lVar12 = *(long *)message;
    local_110[0] = (internal)(byte)((ulong)lVar12 >> 0x3f);
    local_120.data_._0_1_ = (internal)(local_84 != 0);
    testing::internal::CmpHelperEQ<bool,bool>
              ((internal *)local_d8,"test.value < 0","!!is_negative",(bool *)local_110,
               (bool *)&local_120);
    if (local_d8[0] == (internal)0x0) {
      testing::Message::Message((Message *)local_110);
      puVar10 = "";
      if ((anon_union_32_2_4f6aaa2e_for_u *)local_d8._8_8_ != (anon_union_32_2_4f6aaa2e_for_u *)0x0)
      {
        puVar10 = *(uint8_t **)local_d8._8_8_;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_120,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/bytestring/bytestring_test.cc"
                 ,0x454,(char *)puVar10);
      testing::internal::AssertHelper::operator=(&local_120,(Message *)local_110);
      testing::internal::AssertHelper::~AssertHelper(&local_120);
      if (local_110 != (undefined1  [8])0x0) {
        (**(code **)(*(long *)local_110 + 8))();
      }
    }
    if ((anon_union_32_2_4f6aaa2e_for_u *)local_d8._8_8_ != (anon_union_32_2_4f6aaa2e_for_u *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)(local_d8 + 8),
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   local_d8._8_8_);
    }
    local_110[0] = (internal)(-1 < lVar12);
    iVar6 = CBS_is_unsigned_asn1_integer(&local_78);
    local_120.data_._0_1_ = (internal)(iVar6 != 0);
    testing::internal::CmpHelperEQ<bool,bool>
              ((internal *)local_d8,"test.value >= 0","!!CBS_is_unsigned_asn1_integer(&child)",
               (bool *)local_110,(bool *)&local_120);
    if (local_d8[0] == (internal)0x0) {
      testing::Message::Message((Message *)local_110);
      puVar10 = "";
      if ((anon_union_32_2_4f6aaa2e_for_u *)local_d8._8_8_ != (anon_union_32_2_4f6aaa2e_for_u *)0x0)
      {
        puVar10 = *(uint8_t **)local_d8._8_8_;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_120,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/bytestring/bytestring_test.cc"
                 ,0x455,(char *)puVar10);
      testing::internal::AssertHelper::operator=(&local_120,(Message *)local_110);
      testing::internal::AssertHelper::~AssertHelper(&local_120);
      if (local_110 != (undefined1  [8])0x0) {
        (**(code **)(*(long *)local_110 + 8))();
      }
    }
    if ((anon_union_32_2_4f6aaa2e_for_u *)local_d8._8_8_ != (anon_union_32_2_4f6aaa2e_for_u *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)(local_d8 + 8),
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   local_d8._8_8_);
    }
    CBB_zero((CBB *)local_d8);
    iVar6 = CBB_init((CBB *)local_d8,0);
    local_120.data_._0_1_ = (internal)(iVar6 != 0);
    local_118 = (anon_union_32_2_4f6aaa2e_for_u *)0x0;
    if (iVar6 == 0) {
      testing::Message::Message((Message *)&local_e8);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)local_110,(internal *)&local_120,
                 (AssertionResult *)"CBB_init(cbb.get(), 0)","false","true",in_R9);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&local_a8,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/bytestring/bytestring_test.cc"
                 ,0x459,(char *)local_110);
      testing::internal::AssertHelper::operator=((AssertHelper *)&local_a8,(Message *)&local_e8);
LAB_002220aa:
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_a8);
      if (local_110 != (undefined1  [8])local_100) {
        operator_delete((void *)local_110,(ulong)(local_100._0_8_ + 1));
      }
      if ((anon_union_32_2_4f6aaa2e_for_u *)local_e8.span_.data_ !=
          (anon_union_32_2_4f6aaa2e_for_u *)0x0) {
        (**(code **)(*(long *)local_e8.span_.data_ + 8))();
      }
      if (local_118 != (anon_union_32_2_4f6aaa2e_for_u *)0x0) {
        std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&local_118,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &local_118->base);
      }
      CBB_cleanup((CBB *)local_d8);
      goto LAB_00222101;
    }
    iVar6 = CBB_add_asn1_int64((CBB *)local_d8,lVar12);
    local_120.data_._0_1_ = (internal)(iVar6 != 0);
    local_118 = (anon_union_32_2_4f6aaa2e_for_u *)0x0;
    if (iVar6 == 0) {
      testing::Message::Message((Message *)&local_e8);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)local_110,(internal *)&local_120,
                 (AssertionResult *)"CBB_add_asn1_int64(cbb.get(), test.value)","false","true",in_R9
                );
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&local_a8,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/bytestring/bytestring_test.cc"
                 ,0x45a,(char *)local_110);
      testing::internal::AssertHelper::operator=((AssertHelper *)&local_a8,(Message *)&local_e8);
      goto LAB_002220aa;
    }
    iVar6 = CBB_finish((CBB *)local_d8,&local_58._M_head_impl,(size_t *)&local_80);
    local_120.data_._0_1_ = (internal)(iVar6 != 0);
    local_118 = (anon_union_32_2_4f6aaa2e_for_u *)0x0;
    if (iVar6 == 0) {
      testing::Message::Message((Message *)&local_e8);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)local_110,(internal *)&local_120,
                 (AssertionResult *)"CBB_finish(cbb.get(), &out, &len)","false","true",in_R9);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&local_a8,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/bytestring/bytestring_test.cc"
                 ,0x45b,(char *)local_110);
      testing::internal::AssertHelper::operator=((AssertHelper *)&local_a8,(Message *)&local_e8);
      goto LAB_002220aa;
    }
    local_a8.span_.data_ = local_58._M_head_impl;
    local_120.data_ = (AssertHelperData *)local_60;
    local_118 = local_68;
    local_e8.span_.data_ = local_58._M_head_impl;
    local_e8.span_.size_ = (size_t)local_80._M_head_impl;
    testing::internal::CmpHelperEQ<Bytes,Bytes>
              ((internal *)local_110,"Bytes(test.encoding, test.encoding_len)","Bytes(out, len)",
               (Bytes *)&local_120,&local_e8);
    if (local_110[0] == (internal)0x0) {
      testing::Message::Message((Message *)&local_120);
      pcVar11 = "";
      if (local_108 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar11 = (local_108->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&local_e8,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/bytestring/bytestring_test.cc"
                 ,0x45d,pcVar11);
      testing::internal::AssertHelper::operator=((AssertHelper *)&local_e8,(Message *)&local_120);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_e8);
      if ((anon_union_32_2_4f6aaa2e_for_u *)local_120.data_ != (anon_union_32_2_4f6aaa2e_for_u *)0x0
         ) {
        (**(code **)(*(long *)local_120.data_ + 8))();
      }
    }
    if (local_108 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_108,local_108);
    }
    std::unique_ptr<unsigned_char,_bssl::internal::Deleter>::~unique_ptr
              ((unique_ptr<unsigned_char,_bssl::internal::Deleter> *)&local_a8);
    CBB_cleanup((CBB *)local_d8);
    CBB_zero((CBB *)local_d8);
    iVar6 = CBB_init((CBB *)local_d8,0);
    local_120.data_._0_1_ = (internal)(iVar6 != 0);
    local_118 = (anon_union_32_2_4f6aaa2e_for_u *)0x0;
    if (iVar6 == 0) {
      testing::Message::Message((Message *)&local_e8);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)local_110,(internal *)&local_120,
                 (AssertionResult *)"CBB_init(cbb.get(), 0)","false","true",in_R9);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&local_a8,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/bytestring/bytestring_test.cc"
                 ,0x463,(char *)local_110);
      testing::internal::AssertHelper::operator=((AssertHelper *)&local_a8,(Message *)&local_e8);
LAB_00221da5:
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_a8);
      if (local_110 != (undefined1  [8])local_100) {
        operator_delete((void *)local_110,(ulong)(local_100._0_8_ + 1));
      }
      if ((anon_union_32_2_4f6aaa2e_for_u *)local_e8.span_.data_ !=
          (anon_union_32_2_4f6aaa2e_for_u *)0x0) {
        (**(code **)(*(long *)local_e8.span_.data_ + 8))();
      }
      if (local_118 != (anon_union_32_2_4f6aaa2e_for_u *)0x0) {
        std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&local_118,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &local_118->base);
      }
      bVar5 = false;
    }
    else {
      iVar6 = CBB_add_asn1_int64_with_tag((CBB *)local_d8,lVar12,0x80000001);
      local_120.data_._0_1_ = (internal)(iVar6 != 0);
      local_118 = (anon_union_32_2_4f6aaa2e_for_u *)0x0;
      if (iVar6 == 0) {
        testing::Message::Message((Message *)&local_e8);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  ((string *)local_110,(internal *)&local_120,
                   (AssertionResult *)
                   "CBB_add_asn1_int64_with_tag(cbb.get(), test.value, (0x80u << 24) | 1)","false",
                   "true",in_R9);
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&local_a8,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/bytestring/bytestring_test.cc"
                   ,0x465,(char *)local_110);
        testing::internal::AssertHelper::operator=((AssertHelper *)&local_a8,(Message *)&local_e8);
        goto LAB_00221da5;
      }
      iVar6 = CBB_finish((CBB *)local_d8,&local_58._M_head_impl,(size_t *)&local_80);
      local_120.data_._0_1_ = (internal)(iVar6 != 0);
      local_118 = (anon_union_32_2_4f6aaa2e_for_u *)0x0;
      if (iVar6 == 0) {
        testing::Message::Message((Message *)&local_e8);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  ((string *)local_110,(internal *)&local_120,
                   (AssertionResult *)"CBB_finish(cbb.get(), &out, &len)","false","true",in_R9);
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&local_a8,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/bytestring/bytestring_test.cc"
                   ,0x466,(char *)local_110);
        testing::internal::AssertHelper::operator=((AssertHelper *)&local_a8,(Message *)&local_e8);
        goto LAB_00221da5;
      }
      local_50._M_t.super___uniq_ptr_impl<unsigned_char,_bssl::internal::Deleter>._M_t.
      super__Tuple_impl<0UL,_unsigned_char_*,_bssl::internal::Deleter>.
      super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl =
           (__uniq_ptr_data<unsigned_char,_bssl::internal::Deleter,_true,_true>)
           (__uniq_ptr_data<unsigned_char,_bssl::internal::Deleter,_true,_true>)
           local_58._M_head_impl;
      std::vector<unsigned_char,std::allocator<unsigned_char>>::vector<char_const*,void>
                ((vector<unsigned_char,std::allocator<unsigned_char>> *)local_110,(char *)local_60,
                 (char *)((long)&(local_60->base).buf + (long)&(local_68->base).buf),
                 (allocator_type *)&local_120);
      *(char *)local_110 = -0x7f;
      local_e8.span_.size_ = (long)local_108 - (long)local_110;
      local_e8.span_.data_ = (uchar *)local_110;
      local_a8.span_.data_ = local_58._M_head_impl;
      local_a8.span_.size_ = (size_t)local_80._M_head_impl;
      testing::internal::CmpHelperEQ<Bytes,Bytes>
                ((internal *)&local_120,"Bytes(expected)","Bytes(out, len)",&local_e8,&local_a8);
      if (local_120.data_._0_1_ == (internal)0x0) {
        testing::Message::Message((Message *)&local_e8);
        puVar10 = "";
        if (local_118 != (anon_union_32_2_4f6aaa2e_for_u *)0x0) {
          puVar10 = (local_118->base).buf;
        }
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&local_a8,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/bytestring/bytestring_test.cc"
                   ,0x46b,(char *)puVar10);
        testing::internal::AssertHelper::operator=((AssertHelper *)&local_a8,(Message *)&local_e8);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_a8);
        if ((anon_union_32_2_4f6aaa2e_for_u *)local_e8.span_.data_ !=
            (anon_union_32_2_4f6aaa2e_for_u *)0x0) {
          (**(code **)(*(long *)local_e8.span_.data_ + 8))();
        }
      }
      if (local_118 != (anon_union_32_2_4f6aaa2e_for_u *)0x0) {
        std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&local_118,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &local_118->base);
      }
      if (local_110 != (undefined1  [8])0x0) {
        operator_delete((void *)local_110,local_100._0_8_ - (long)local_110);
      }
      std::unique_ptr<unsigned_char,_bssl::internal::Deleter>::~unique_ptr(&local_50);
      bVar5 = true;
    }
    CBB_cleanup((CBB *)local_d8);
    testing::ScopedTrace::~ScopedTrace((ScopedTrace *)(local_100 + 0x17));
    testing::ScopedTrace::~ScopedTrace(&local_121);
    if (!bVar5) goto LAB_00222115;
    pbVar8 = local_48 + 0x18;
    uVar7 = CONCAT71((int7)((ulong)extraout_RAX >> 8),pbVar8 == (bool *)0x138);
  } while (pbVar8 != (bool *)0x138);
  pbVar8 = (bool *)&DAT_006f37e0;
  lVar12 = 0x90;
  do {
    paVar1 = *(anon_union_32_2_4f6aaa2e_for_u **)(pbVar8 + -0x10);
    pbVar3 = *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)(pbVar8 + -8);
    local_d8._0_8_ = paVar1;
    local_d8._8_8_ = pbVar3;
    local_68 = (anon_union_32_2_4f6aaa2e_for_u *)pbVar8;
    testing::ScopedTrace::ScopedTrace<Bytes>
              ((ScopedTrace *)&local_a8,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/bytestring/bytestring_test.cc"
               ,0x470,(Bytes *)local_d8);
    local_110 = (undefined1  [8])paVar1;
    local_108 = pbVar3;
    iVar6 = CBS_get_asn1_int64((CBS *)local_110,(int64_t *)&local_78);
    local_98[0] = (internal)(iVar6 == 0);
    local_90 = (anon_union_32_2_4f6aaa2e_for_u *)0x0;
    if (iVar6 != 0) {
      testing::Message::Message((Message *)&local_120);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)local_d8,(internal *)local_98,
                 (AssertionResult *)"CBS_get_asn1_int64(&cbs, &value)","true","false",in_R9);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&local_e8,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/bytestring/bytestring_test.cc"
                 ,0x475,(char *)local_d8._0_8_);
      testing::internal::AssertHelper::operator=((AssertHelper *)&local_e8,(Message *)&local_120);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_e8);
      if ((anon_union_32_2_4f6aaa2e_for_u *)local_d8._0_8_ != &local_c8) {
        operator_delete((void *)local_d8._0_8_,(ulong)(local_c8.base.buf + 1));
      }
      if ((anon_union_32_2_4f6aaa2e_for_u *)local_120.data_ != (anon_union_32_2_4f6aaa2e_for_u *)0x0
         ) {
        (**(code **)(*(long *)local_120.data_ + 8))();
      }
    }
    if (local_90 != (anon_union_32_2_4f6aaa2e_for_u *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_90,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &local_90->base);
    }
    local_110 = (undefined1  [8])paVar1;
    local_108 = pbVar3;
    iVar6 = CBS_get_asn1((CBS *)local_110,(CBS *)local_d8,2);
    if (iVar6 != 0) {
      iVar6 = CBS_is_valid_asn1_integer((CBS *)local_d8,(int *)0x0);
      local_120.data_._0_1_ = (internal)(iVar6 != 0);
      testing::internal::CmpHelperEQ<bool,bool>
                ((internal *)local_98,"test.overflow","!!CBS_is_valid_asn1_integer(&child, __null)",
                 (bool *)local_68,(bool *)&local_120);
      if (local_98[0] == (internal)0x0) {
        testing::Message::Message((Message *)&local_120);
        puVar10 = "";
        if (local_90 != (anon_union_32_2_4f6aaa2e_for_u *)0x0) {
          puVar10 = (local_90->base).buf;
        }
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&local_e8,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/bytestring/bytestring_test.cc"
                   ,0x47a,(char *)puVar10);
        testing::internal::AssertHelper::operator=((AssertHelper *)&local_e8,(Message *)&local_120);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_e8);
        if ((anon_union_32_2_4f6aaa2e_for_u *)local_120.data_ !=
            (anon_union_32_2_4f6aaa2e_for_u *)0x0) {
          (**(code **)(*(long *)local_120.data_ + 8))();
        }
      }
      if (local_90 != (anon_union_32_2_4f6aaa2e_for_u *)0x0) {
        std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&local_90,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &local_90->base);
      }
    }
    testing::ScopedTrace::~ScopedTrace((ScopedTrace *)&local_a8);
    pbVar8 = (bool *)((long)local_68 + 0x18);
    lVar12 = lVar12 + -0x18;
  } while (lVar12 != 0);
  pbVar8 = (bool *)0x0;
  do {
    paVar1 = *(anon_union_32_2_4f6aaa2e_for_u **)(pbVar8 + 0x6f3870);
    paVar2 = *(anon_union_32_2_4f6aaa2e_for_u **)(pbVar8 + 0x6f3878);
    local_d8._0_8_ = paVar1;
    local_d8._8_8_ = paVar2;
    testing::ScopedTrace::ScopedTrace<Bytes>
              ((ScopedTrace *)&local_84,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/bytestring/bytestring_test.cc"
               ,0x47f,(Bytes *)local_d8);
    local_48 = pbVar8 + 0x6f3868;
    testing::ScopedTrace::ScopedTrace<long>
              (&local_121,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/bytestring/bytestring_test.cc"
               ,0x480,(long *)(pbVar8 + 0x6f3868));
    tag = *(CBS_ASN1_TAG *)(pbVar8 + 0x6f3860);
    local_98 = (undefined1  [8])paVar1;
    local_90 = paVar2;
    local_68 = (anon_union_32_2_4f6aaa2e_for_u *)pbVar8;
    local_60 = paVar2;
    iVar6 = CBS_get_asn1_int64_with_tag((CBS *)local_98,(int64_t *)&local_a8,tag);
    local_108 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    if (iVar6 == 0) {
      local_110[0] = (internal)(iVar6 != 0);
      testing::Message::Message((Message *)&local_78);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)local_d8,(internal *)local_110,
                 (AssertionResult *)"CBS_get_asn1_int64_with_tag(&cbs, &value, test.tag)","false",
                 "true",in_R9);
      testing::internal::AssertHelper::AssertHelper
                (&local_120,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/bytestring/bytestring_test.cc"
                 ,0x487,(char *)local_d8._0_8_);
      testing::internal::AssertHelper::operator=(&local_120,(Message *)&local_78);
      testing::internal::AssertHelper::~AssertHelper(&local_120);
      if ((anon_union_32_2_4f6aaa2e_for_u *)local_d8._0_8_ != &local_c8) {
        operator_delete((void *)local_d8._0_8_,(ulong)(local_c8.base.buf + 1));
      }
      AVar9.data_ = (AssertHelperData *)CONCAT44(local_78.data._4_4_,local_78.data._0_4_);
LAB_00222c45:
      if ((anon_union_32_2_4f6aaa2e_for_u *)AVar9.data_ != (anon_union_32_2_4f6aaa2e_for_u *)0x0) {
        (*(code *)((cbb_child_st *)AVar9.data_)->base->len)();
      }
      if (local_108 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&local_108,local_108);
      }
      testing::ScopedTrace::~ScopedTrace(&local_121);
      testing::ScopedTrace::~ScopedTrace((ScopedTrace *)&local_84);
      return;
    }
    local_78.data._0_4_ = 0;
    local_110 = (undefined1  [8])local_90;
    testing::internal::CmpHelperEQ<unsigned_int,unsigned_long>
              ((internal *)local_d8,"0u","CBS_len(&cbs)",(uint *)&local_78,
               (unsigned_long *)local_110);
    if (local_d8[0] == (internal)0x0) {
      testing::Message::Message((Message *)local_110);
      puVar10 = "";
      if ((anon_union_32_2_4f6aaa2e_for_u *)local_d8._8_8_ != (anon_union_32_2_4f6aaa2e_for_u *)0x0)
      {
        puVar10 = *(uint8_t **)local_d8._8_8_;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&local_78,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/bytestring/bytestring_test.cc"
                 ,0x488,(char *)puVar10);
      testing::internal::AssertHelper::operator=((AssertHelper *)&local_78,(Message *)local_110);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_78);
      if (local_110 != (undefined1  [8])0x0) {
        (**(code **)(*(long *)local_110 + 8))();
      }
    }
    if ((anon_union_32_2_4f6aaa2e_for_u *)local_d8._8_8_ != (anon_union_32_2_4f6aaa2e_for_u *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)(local_d8 + 8),
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   local_d8._8_8_);
    }
    testing::internal::CmpHelperEQ<long,long>
              ((internal *)local_d8,"test.value","value",(long *)local_48,(long *)&local_a8);
    if (local_d8[0] == (internal)0x0) {
      testing::Message::Message((Message *)local_110);
      puVar10 = "";
      if ((anon_union_32_2_4f6aaa2e_for_u *)local_d8._8_8_ != (anon_union_32_2_4f6aaa2e_for_u *)0x0)
      {
        puVar10 = *(uint8_t **)local_d8._8_8_;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&local_78,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/bytestring/bytestring_test.cc"
                 ,0x489,(char *)puVar10);
      testing::internal::AssertHelper::operator=((AssertHelper *)&local_78,(Message *)local_110);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_78);
      if (local_110 != (undefined1  [8])0x0) {
        (**(code **)(*(long *)local_110 + 8))();
      }
    }
    if ((anon_union_32_2_4f6aaa2e_for_u *)local_d8._8_8_ != (anon_union_32_2_4f6aaa2e_for_u *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)(local_d8 + 8),
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   local_d8._8_8_);
    }
    local_90 = local_60;
    local_98 = (undefined1  [8])paVar1;
    iVar6 = CBS_get_asn1((CBS *)local_98,&local_78,tag);
    iVar4 = (internal)(iVar6 != 0);
    local_108 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    local_110[0] = iVar4;
    if (iVar6 == 0) {
      testing::Message::Message((Message *)&local_120);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)local_d8,(internal *)local_110,
                 (AssertionResult *)"CBS_get_asn1(&cbs, &child, test.tag)","false","true",in_R9);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&local_e8,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/bytestring/bytestring_test.cc"
                 ,0x48e,(char *)local_d8._0_8_);
      testing::internal::AssertHelper::operator=((AssertHelper *)&local_e8,(Message *)&local_120);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_e8);
      AVar9.data_ = local_120.data_;
      if ((anon_union_32_2_4f6aaa2e_for_u *)local_d8._0_8_ != &local_c8) {
        operator_delete((void *)local_d8._0_8_,(ulong)(local_c8.base.buf + 1));
        AVar9.data_ = local_120.data_;
      }
      goto LAB_00222c45;
    }
    iVar6 = CBS_is_valid_asn1_integer(&local_78,(int *)&local_50);
    local_110[0] = (internal)(iVar6 != 0);
    local_108 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    if (iVar6 == 0) {
      testing::Message::Message((Message *)&local_120);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)local_d8,(internal *)local_110,
                 (AssertionResult *)"CBS_is_valid_asn1_integer(&child, &is_negative)","false","true"
                 ,in_R9);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&local_e8,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/bytestring/bytestring_test.cc"
                 ,0x48f,(char *)local_d8._0_8_);
      testing::internal::AssertHelper::operator=((AssertHelper *)&local_e8,(Message *)&local_120);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_e8);
      if ((anon_union_32_2_4f6aaa2e_for_u *)local_d8._0_8_ != &local_c8) {
        operator_delete((void *)local_d8._0_8_,(ulong)(local_c8.base.buf + 1));
      }
      if ((anon_union_32_2_4f6aaa2e_for_u *)local_120.data_ != (anon_union_32_2_4f6aaa2e_for_u *)0x0
         ) {
        (**(code **)(*(long *)local_120.data_ + 8))();
      }
    }
    if (local_108 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_108,local_108);
    }
    lVar12 = *(long *)((long)local_68 + 0x6f3868);
    local_110[0] = (internal)(byte)((ulong)lVar12 >> 0x3f);
    local_120.data_._0_1_ =
         (internal)
         ((int)local_50._M_t.super___uniq_ptr_impl<unsigned_char,_bssl::internal::Deleter>._M_t.
               super__Tuple_impl<0UL,_unsigned_char_*,_bssl::internal::Deleter>.
               super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl != 0);
    testing::internal::CmpHelperEQ<bool,bool>
              ((internal *)local_d8,"test.value < 0","!!is_negative",(bool *)local_110,
               (bool *)&local_120);
    if (local_d8[0] == (internal)0x0) {
      testing::Message::Message((Message *)local_110);
      puVar10 = "";
      if ((anon_union_32_2_4f6aaa2e_for_u *)local_d8._8_8_ != (anon_union_32_2_4f6aaa2e_for_u *)0x0)
      {
        puVar10 = *(uint8_t **)local_d8._8_8_;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_120,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/bytestring/bytestring_test.cc"
                 ,0x490,(char *)puVar10);
      testing::internal::AssertHelper::operator=(&local_120,(Message *)local_110);
      testing::internal::AssertHelper::~AssertHelper(&local_120);
      if (local_110 != (undefined1  [8])0x0) {
        (**(code **)(*(long *)local_110 + 8))();
      }
    }
    if ((anon_union_32_2_4f6aaa2e_for_u *)local_d8._8_8_ != (anon_union_32_2_4f6aaa2e_for_u *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)(local_d8 + 8),
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   local_d8._8_8_);
    }
    local_110[0] = (internal)(-1 < lVar12);
    iVar6 = CBS_is_unsigned_asn1_integer(&local_78);
    local_120.data_._0_1_ = (internal)(iVar6 != 0);
    testing::internal::CmpHelperEQ<bool,bool>
              ((internal *)local_d8,"test.value >= 0","!!CBS_is_unsigned_asn1_integer(&child)",
               (bool *)local_110,(bool *)&local_120);
    if (local_d8[0] == (internal)0x0) {
      testing::Message::Message((Message *)local_110);
      puVar10 = "";
      if ((anon_union_32_2_4f6aaa2e_for_u *)local_d8._8_8_ != (anon_union_32_2_4f6aaa2e_for_u *)0x0)
      {
        puVar10 = *(uint8_t **)local_d8._8_8_;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_120,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/bytestring/bytestring_test.cc"
                 ,0x491,(char *)puVar10);
      testing::internal::AssertHelper::operator=(&local_120,(Message *)local_110);
      testing::internal::AssertHelper::~AssertHelper(&local_120);
      if (local_110 != (undefined1  [8])0x0) {
        (**(code **)(*(long *)local_110 + 8))();
      }
    }
    if ((anon_union_32_2_4f6aaa2e_for_u *)local_d8._8_8_ != (anon_union_32_2_4f6aaa2e_for_u *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)(local_d8 + 8),
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   local_d8._8_8_);
    }
    CBB_zero((CBB *)local_d8);
    iVar6 = CBB_init((CBB *)local_d8,0);
    local_120.data_._0_1_ = (internal)(iVar6 != 0);
    local_118 = (anon_union_32_2_4f6aaa2e_for_u *)0x0;
    if (iVar6 == 0) {
      testing::Message::Message((Message *)&local_e8);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)local_110,(internal *)&local_120,
                 (AssertionResult *)"CBB_init(cbb.get(), 0)","false","true",in_R9);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&local_80,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/bytestring/bytestring_test.cc"
                 ,0x495,(char *)local_110);
      testing::internal::AssertHelper::operator=((AssertHelper *)&local_80,(Message *)&local_e8);
LAB_00222a8d:
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_80);
      if (local_110 != (undefined1  [8])local_100) {
        operator_delete((void *)local_110,(ulong)(local_100._0_8_ + 1));
      }
      if ((anon_union_32_2_4f6aaa2e_for_u *)local_e8.span_.data_ !=
          (anon_union_32_2_4f6aaa2e_for_u *)0x0) {
        (**(code **)(*(long *)local_e8.span_.data_ + 8))();
      }
      if (local_118 != (anon_union_32_2_4f6aaa2e_for_u *)0x0) {
        std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&local_118,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &local_118->base);
      }
      bVar5 = true;
    }
    else {
      iVar6 = CBB_add_asn1_int64_with_tag((CBB *)local_d8,lVar12,tag);
      local_120.data_._0_1_ = (internal)(iVar6 != 0);
      local_118 = (anon_union_32_2_4f6aaa2e_for_u *)0x0;
      if (iVar6 == 0) {
        testing::Message::Message((Message *)&local_e8);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  ((string *)local_110,(internal *)&local_120,
                   (AssertionResult *)"CBB_add_asn1_int64_with_tag(cbb.get(), test.value, test.tag)"
                   ,"false","true",in_R9);
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&local_80,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/bytestring/bytestring_test.cc"
                   ,0x496,(char *)local_110);
        testing::internal::AssertHelper::operator=((AssertHelper *)&local_80,(Message *)&local_e8);
        goto LAB_00222a8d;
      }
      iVar6 = CBB_finish((CBB *)local_d8,&local_40._M_head_impl,(size_t *)&local_58);
      local_120.data_._0_1_ = (internal)(iVar6 != 0);
      local_118 = (anon_union_32_2_4f6aaa2e_for_u *)0x0;
      if (iVar6 == 0) {
        testing::Message::Message((Message *)&local_e8);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  ((string *)local_110,(internal *)&local_120,
                   (AssertionResult *)"CBB_finish(cbb.get(), &out, &len)","false","true",in_R9);
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&local_80,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/bytestring/bytestring_test.cc"
                   ,0x497,(char *)local_110);
        testing::internal::AssertHelper::operator=((AssertHelper *)&local_80,(Message *)&local_e8);
        goto LAB_00222a8d;
      }
      local_80._M_head_impl = local_40._M_head_impl;
      local_118 = local_60;
      local_e8.span_.data_ = local_40._M_head_impl;
      local_e8.span_.size_ = (size_t)local_58._M_head_impl;
      local_120.data_ = (AssertHelperData *)paVar1;
      testing::internal::CmpHelperEQ<Bytes,Bytes>
                ((internal *)local_110,"Bytes(test.encoding, test.encoding_len)","Bytes(out, len)",
                 (Bytes *)&local_120,&local_e8);
      if (local_110[0] == (internal)0x0) {
        testing::Message::Message((Message *)&local_120);
        pcVar11 = "";
        if (local_108 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          pcVar11 = (local_108->_M_dataplus)._M_p;
        }
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&local_e8,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/bytestring/bytestring_test.cc"
                   ,0x499,pcVar11);
        testing::internal::AssertHelper::operator=((AssertHelper *)&local_e8,(Message *)&local_120);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_e8);
        if ((anon_union_32_2_4f6aaa2e_for_u *)local_120.data_ !=
            (anon_union_32_2_4f6aaa2e_for_u *)0x0) {
          (**(code **)(*(long *)local_120.data_ + 8))();
        }
      }
      if (local_108 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&local_108,local_108);
      }
      std::unique_ptr<unsigned_char,_bssl::internal::Deleter>::~unique_ptr
                ((unique_ptr<unsigned_char,_bssl::internal::Deleter> *)&local_80);
      bVar5 = false;
    }
    CBB_cleanup((CBB *)local_d8);
    testing::ScopedTrace::~ScopedTrace(&local_121);
    testing::ScopedTrace::~ScopedTrace((ScopedTrace *)&local_84);
    pbVar8 = (bool *)((long)local_68 + 0x20);
    if (bVar5 || local_68 == (anon_union_32_2_4f6aaa2e_for_u *)0x80) {
      return;
    }
  } while( true );
}

Assistant:

TEST(CBSTest, ASN1Int64) {
  for (const ASN1Int64Test &test : kASN1Int64Tests) {
    SCOPED_TRACE(Bytes(test.encoding, test.encoding_len));
    SCOPED_TRACE(test.value);
    CBS cbs;
    int64_t value;
    uint8_t *out;
    size_t len;

    CBS_init(&cbs, (const uint8_t *)test.encoding, test.encoding_len);
    ASSERT_TRUE(CBS_get_asn1_int64(&cbs, &value));
    EXPECT_EQ(0u, CBS_len(&cbs));
    EXPECT_EQ(test.value, value);

    CBS child;
    int is_negative;
    CBS_init(&cbs, (const uint8_t *)test.encoding, test.encoding_len);
    ASSERT_TRUE(CBS_get_asn1(&cbs, &child, CBS_ASN1_INTEGER));
    EXPECT_TRUE(CBS_is_valid_asn1_integer(&child, &is_negative));
    EXPECT_EQ(test.value < 0, !!is_negative);
    EXPECT_EQ(test.value >= 0, !!CBS_is_unsigned_asn1_integer(&child));

    {
      bssl::ScopedCBB cbb;
      ASSERT_TRUE(CBB_init(cbb.get(), 0));
      ASSERT_TRUE(CBB_add_asn1_int64(cbb.get(), test.value));
      ASSERT_TRUE(CBB_finish(cbb.get(), &out, &len));
      bssl::UniquePtr<uint8_t> scoper(out);
      EXPECT_EQ(Bytes(test.encoding, test.encoding_len), Bytes(out, len));
    }

    {
      // Overwrite the tag.
      bssl::ScopedCBB cbb;
      ASSERT_TRUE(CBB_init(cbb.get(), 0));
      ASSERT_TRUE(CBB_add_asn1_int64_with_tag(cbb.get(), test.value,
                                              CBS_ASN1_CONTEXT_SPECIFIC | 1));
      ASSERT_TRUE(CBB_finish(cbb.get(), &out, &len));
      bssl::UniquePtr<uint8_t> scoper(out);
      std::vector<uint8_t> expected(test.encoding,
                                    test.encoding + test.encoding_len);
      expected[0] = 0x81;
      EXPECT_EQ(Bytes(expected), Bytes(out, len));
    }
  }

  for (const ASN1InvalidInt64Test &test : kASN1InvalidInt64Tests) {
    SCOPED_TRACE(Bytes(test.encoding, test.encoding_len));
    CBS cbs;
    int64_t value;

    CBS_init(&cbs, (const uint8_t *)test.encoding, test.encoding_len);
    EXPECT_FALSE(CBS_get_asn1_int64(&cbs, &value));

    CBS_init(&cbs, (const uint8_t *)test.encoding, test.encoding_len);
    CBS child;
    if (CBS_get_asn1(&cbs, &child, CBS_ASN1_INTEGER)) {
      EXPECT_EQ(test.overflow, !!CBS_is_valid_asn1_integer(&child, NULL));
    }
  }

  for (const ASN1Int64WithTagTest &test : kASN1Int64WithTagTests) {
    SCOPED_TRACE(Bytes(test.encoding, test.encoding_len));
    SCOPED_TRACE(test.value);
    CBS cbs;
    int64_t value;
    uint8_t *out;
    size_t len;

    CBS_init(&cbs, (const uint8_t *)test.encoding, test.encoding_len);
    ASSERT_TRUE(CBS_get_asn1_int64_with_tag(&cbs, &value, test.tag));
    EXPECT_EQ(0u, CBS_len(&cbs));
    EXPECT_EQ(test.value, value);

    CBS child;
    int is_negative;
    CBS_init(&cbs, (const uint8_t *)test.encoding, test.encoding_len);
    ASSERT_TRUE(CBS_get_asn1(&cbs, &child, test.tag));
    EXPECT_TRUE(CBS_is_valid_asn1_integer(&child, &is_negative));
    EXPECT_EQ(test.value < 0, !!is_negative);
    EXPECT_EQ(test.value >= 0, !!CBS_is_unsigned_asn1_integer(&child));

    {
      bssl::ScopedCBB cbb;
      ASSERT_TRUE(CBB_init(cbb.get(), 0));
      ASSERT_TRUE(CBB_add_asn1_int64_with_tag(cbb.get(), test.value, test.tag));
      ASSERT_TRUE(CBB_finish(cbb.get(), &out, &len));
      bssl::UniquePtr<uint8_t> scoper(out);
      EXPECT_EQ(Bytes(test.encoding, test.encoding_len), Bytes(out, len));
    }
  }
}